

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::TrimCapabilitiesPass::TrimCapabilitiesPass(TrimCapabilitiesPass *this)

{
  const_iterator begin;
  const_iterator end;
  const_iterator pvVar1;
  const_iterator pvVar2;
  const_iterator __first;
  const_iterator __last;
  allocator<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>_>
  local_13;
  key_equal local_12;
  hasher local_11;
  TrimCapabilitiesPass *local_10;
  TrimCapabilitiesPass *this_local;
  
  local_10 = this;
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__TrimCapabilitiesPass_010e6688;
  begin = std::array<spv::Capability,_32UL>::cbegin(&kSupportedCapabilities);
  end = std::array<spv::Capability,_32UL>::cend(&kSupportedCapabilities);
  EnumSet<spv::Capability>::EnumSet<spv::Capability_const*>(&this->supportedCapabilities_,begin,end)
  ;
  pvVar1 = std::array<spv::Capability,_1UL>::cbegin(&kForbiddenCapabilities);
  pvVar2 = std::array<spv::Capability,_1UL>::cend(&kForbiddenCapabilities);
  EnumSet<spv::Capability>::EnumSet<spv::Capability_const*>
            (&this->forbiddenCapabilities_,pvVar1,pvVar2);
  pvVar1 = std::array<spv::Capability,_1UL>::cbegin(&kUntouchableCapabilities);
  pvVar2 = std::array<spv::Capability,_1UL>::cend(&kUntouchableCapabilities);
  EnumSet<spv::Capability>::EnumSet<spv::Capability_const*>
            (&this->untouchableCapabilities_,pvVar1,pvVar2);
  __first = std::
            array<std::pair<spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_13UL>
            ::cbegin((array<std::pair<spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_13UL>
                      *)kOpcodeHandlers);
  __last = std::
           array<std::pair<spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_13UL>
           ::cend((array<std::pair<spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_13UL>
                   *)kOpcodeHandlers);
  std::
  allocator<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>_>
  ::allocator(&local_13);
  std::
  unordered_multimap<spv::Op,std::optional<spv::Capability>(*)(spvtools::opt::Instruction_const*),spvtools::opt::ClassEnumHash,std::equal_to<spv::Op>,std::allocator<std::pair<spv::Op_const,std::optional<spv::Capability>(*)(spvtools::opt::Instruction_const*)>>>
  ::
  unordered_multimap<std::pair<spv::Op,std::optional<spv::Capability>(*)(spvtools::opt::Instruction_const*)>const*>
            ((unordered_multimap<spv::Op,std::optional<spv::Capability>(*)(spvtools::opt::Instruction_const*),spvtools::opt::ClassEnumHash,std::equal_to<spv::Op>,std::allocator<std::pair<spv::Op_const,std::optional<spv::Capability>(*)(spvtools::opt::Instruction_const*)>>>
              *)&this->opcodeHandlers_,__first,__last,0,&local_11,&local_12,&local_13);
  std::
  allocator<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>_>
  ::~allocator(&local_13);
  return;
}

Assistant:

TrimCapabilitiesPass::TrimCapabilitiesPass()
    : supportedCapabilities_(
          TrimCapabilitiesPass::kSupportedCapabilities.cbegin(),
          TrimCapabilitiesPass::kSupportedCapabilities.cend()),
      forbiddenCapabilities_(
          TrimCapabilitiesPass::kForbiddenCapabilities.cbegin(),
          TrimCapabilitiesPass::kForbiddenCapabilities.cend()),
      untouchableCapabilities_(
          TrimCapabilitiesPass::kUntouchableCapabilities.cbegin(),
          TrimCapabilitiesPass::kUntouchableCapabilities.cend()),
      opcodeHandlers_(kOpcodeHandlers.cbegin(), kOpcodeHandlers.cend()) {}